

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O0

int __thiscall Fl_Menu_::find_index(Fl_Menu_ *this,Fl_Menu_Item *item)

{
  Fl_Menu_Item *pFVar1;
  int iVar2;
  Fl_Menu_Item *max;
  Fl_Menu_Item *item_local;
  Fl_Menu_ *this_local;
  
  pFVar1 = this->menu_;
  iVar2 = size(this);
  if ((item < this->menu_) || (pFVar1 + iVar2 <= item)) {
    this_local._4_4_ = -1;
  }
  else {
    this_local._4_4_ = (int)(((long)item - (long)this->menu_) / 0x38);
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Menu_::find_index(const Fl_Menu_Item *item) const {
  Fl_Menu_Item *max = menu_+size();
  if (item<menu_ || item>=max) return(-1);
  return (int) (item-menu_);
}